

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

value * __thiscall cppcms::json::value::at(value *this,char *cpath)

{
  size_t sVar1;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  iterator iVar2;
  _Alloc_hider _Var3;
  bad_value_cast *pbVar4;
  char *pcVar5;
  size_t pos;
  string_key path;
  string local_c0;
  string_key part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  path.end_ = cpath + -1;
  do {
    pcVar5 = path.end_ + 1;
    path.end_ = path.end_ + 1;
  } while (*pcVar5 != '\0');
  path.key_._M_dataplus._M_p = (pointer)&path.key_.field_2;
  path.key_._M_string_length = 0;
  path.key_.field_2._M_local_buf[0] = '\0';
  pos = 0;
  path.begin_ = cpath;
  while( true ) {
    sVar1 = string_key::find(&path,'.',pos);
    string_key::unowned_substr(&part,&path,pos,sVar1 - pos);
    _Var3._M_p = part.begin_;
    pcVar5 = part.end_;
    if (part.begin_ == (char *)0x0) {
      _Var3 = part.key_._M_dataplus;
      pcVar5 = part.key_._M_dataplus._M_p + part.key_._M_string_length;
    }
    if (pcVar5 == _Var3._M_p) {
      pbVar4 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_c0,"Invalid path provided",(allocator *)&local_70);
      bad_value_cast::bad_value_cast(pbVar4,&local_c0);
      __cxa_throw(pbVar4,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if (*(int *)&(*(_Base_ptr *)this)[1]._M_left != 5) {
      pbVar4 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_70);
      bad_value_cast::bad_value_cast
                (pbVar4,&local_c0,*(json_type *)&(*(_Base_ptr *)this)[1]._M_left,is_object);
      __cxa_throw(pbVar4,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    this_00 = &object(this)->_M_t;
    iVar2 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find(this_00,&part);
    if ((_Rb_tree_header *)iVar2._M_node == &(this_00->_M_impl).super__Rb_tree_header) break;
    std::__cxx11::string::~string((string *)&part.key_);
    _Var3._M_p = path.begin_;
    pcVar5 = path.end_;
    if (path.begin_ == (char *)0x0) {
      _Var3 = path.key_._M_dataplus;
      pcVar5 = path.key_._M_dataplus._M_p + path.key_._M_string_length;
    }
    this = (value *)&iVar2._M_node[2]._M_left;
    if ((sVar1 == 0xffffffffffffffff) ||
       (pos = sVar1 + 1, (ulong)((long)pcVar5 - (long)_Var3._M_p) <= pos)) {
      std::__cxx11::string::~string((string *)&path.key_);
      return (value *)(_Base_ptr *)this;
    }
  }
  pbVar4 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  string_key::str_abi_cxx11_(&local_50,&part);
  std::operator+(&local_70,"Member ",&local_50);
  std::operator+(&local_c0,&local_70," not found");
  bad_value_cast::bad_value_cast(pbVar4,&local_c0);
  __cxa_throw(pbVar4,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value &value::at(char const *cpath)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object)
				throw bad_value_cast("",ptr->type(),json::is_object);
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end())
				throw bad_value_cast("Member "+part.str()+" not found");
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}